

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<std::pair<int,int>>::emplace<std::pair<int,int>const&>
          (QPodArrayOps<std::pair<int,int>> *this,qsizetype i,pair<int,_int> *args)

{
  int *piVar1;
  pair<int,_int> pVar2;
  pair<int,_int> *ppVar3;
  GrowthPosition where;
  
  piVar1 = *(int **)this;
  if ((piVar1 == (int *)0x0) || (1 < *piVar1)) {
LAB_005abf85:
    pVar2 = *args;
    where = (GrowthPosition)(i == 0 && *(long *)(this + 0x10) != 0);
    QArrayDataPointer<std::pair<int,_int>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<int,_int>_> *)this,where,1,(pair<int,_int> **)0x0,
               (QArrayDataPointer<std::pair<int,_int>_> *)0x0);
    ppVar3 = QPodArrayOps<std::pair<int,_int>_>::createHole
                       ((QPodArrayOps<std::pair<int,_int>_> *)this,where,i,1);
    *ppVar3 = pVar2;
  }
  else {
    if ((*(long *)(this + 0x10) == i) &&
       (*(long *)(piVar1 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar1 + 0x1fU & 0xfffffffffffffff0)) >> 3) + i)) {
      *(pair<int,_int> *)(*(long *)(this + 8) + i * 8) = *args;
    }
    else {
      if ((i != 0) || (((long)piVar1 + 0x1fU & 0xfffffffffffffff0) == *(ulong *)(this + 8)))
      goto LAB_005abf85;
      *(pair<int,_int> *)(*(ulong *)(this + 8) - 8) = *args;
      *(long *)(this + 8) = *(long *)(this + 8) + -8;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }